

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageLoadTotals(Fts5Storage *p,int bCache)

{
  int iVar1;
  Fts5Index *p_00;
  byte bVar2;
  Fts5Data *p_01;
  uint uVar3;
  long lVar4;
  u64 *v;
  long lVar5;
  
  if (p->bTotalsValid != 0) {
    return 0;
  }
  p_00 = p->pIndex;
  v = (u64 *)p->aTotalSize;
  lVar4 = (long)p_00->pConfig->nCol;
  p->nTotalRow = 0;
  memset(v,0,lVar4 * 8);
  p_01 = fts5DataRead(p_00,1);
  if ((p_00->rc == 0) && (p_01->nn != 0)) {
    bVar2 = sqlite3Fts5GetVarint(p_01->p,(u64 *)&p->nTotalRow);
    uVar3 = (uint)bVar2;
    for (lVar5 = 0; ((int)uVar3 < p_01->nn && (lVar5 < lVar4)); lVar5 = lVar5 + 1) {
      bVar2 = sqlite3Fts5GetVarint(p_01->p + uVar3,v);
      uVar3 = uVar3 + bVar2;
      v = v + 1;
    }
  }
  sqlite3_free(p_01);
  iVar1 = p_00->rc;
  p_00->rc = 0;
  p->bTotalsValid = bCache;
  return iVar1;
}

Assistant:

static int fts5StorageLoadTotals(Fts5Storage *p, int bCache){
  int rc = SQLITE_OK;
  if( p->bTotalsValid==0 ){
    rc = sqlite3Fts5IndexGetAverages(p->pIndex, &p->nTotalRow, p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return rc;
}